

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_writeSkippableFrame
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,uint magicVariant)

{
  BYTE *op;
  uint magicVariant_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (dstCapacity < srcSize + 8) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else if (srcSize < 0x100000000) {
    if (magicVariant < 0x10) {
      MEM_writeLE32(dst,magicVariant + 0x184d2a50);
      MEM_writeLE32((void *)((long)dst + 4),(U32)srcSize);
      memcpy((void *)((long)dst + 8),src,srcSize);
      dst_local = (void *)(srcSize + 8);
    }
    else {
      dst_local = (void *)0xffffffffffffffd6;
    }
  }
  else {
    dst_local = (void *)0xffffffffffffffb8;
  }
  return (size_t)dst_local;
}

Assistant:

size_t ZSTD_writeSkippableFrame(void* dst, size_t dstCapacity,
                                const void* src, size_t srcSize, unsigned magicVariant) {
    BYTE* op = (BYTE*)dst;
    RETURN_ERROR_IF(dstCapacity < srcSize + ZSTD_SKIPPABLEHEADERSIZE /* Skippable frame overhead */,
                    dstSize_tooSmall, "Not enough room for skippable frame");
    RETURN_ERROR_IF(srcSize > (unsigned)0xFFFFFFFF, srcSize_wrong, "Src size too large for skippable frame");
    RETURN_ERROR_IF(magicVariant > 15, parameter_outOfBound, "Skippable frame magic number variant not supported");

    MEM_writeLE32(op, (U32)(ZSTD_MAGIC_SKIPPABLE_START + magicVariant));
    MEM_writeLE32(op+4, (U32)srcSize);
    ZSTD_memcpy(op+8, src, srcSize);
    return srcSize + ZSTD_SKIPPABLEHEADERSIZE;
}